

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O3

void embree::avx512::OrientedDiscMiMBIntersector1<4,_true>::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *Disc)

{
  float fVar1;
  undefined4 uVar2;
  float fVar3;
  Geometry *pGVar4;
  long lVar5;
  long lVar6;
  RTCFilterFunctionN p_Var7;
  bool bVar8;
  float fVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  byte bVar18;
  uint uVar19;
  ulong uVar20;
  Scene *pSVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  uint uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  int local_134;
  Scene *local_130;
  undefined4 local_128;
  undefined4 local_124;
  undefined4 local_120;
  undefined4 local_11c;
  undefined4 local_118;
  undefined4 local_114;
  uint local_110;
  uint local_10c;
  uint local_108;
  RTCFilterFunctionNArguments local_f8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [32];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 auVar42 [64];
  
  pSVar21 = context->scene;
  uVar14 = (ulong)(Disc->primIDs).field_0.i[0];
  local_130 = pSVar21;
  pGVar4 = (pSVar21->geometries).items[Disc->sharedGeomID].ptr;
  fVar1 = (pGVar4->time_range).lower;
  fVar9 = pGVar4->fnumTimeSegments *
          (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar1) / ((pGVar4->time_range).upper - fVar1)
          );
  auVar39 = vroundss_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9),9);
  auVar39 = vminss_avx(auVar39,ZEXT416((uint)(pGVar4->fnumTimeSegments + -1.0)));
  auVar39 = vmaxss_avx(ZEXT816(0) << 0x20,auVar39);
  fVar9 = fVar9 - auVar39._0_4_;
  iVar16 = (int)auVar39._0_4_;
  lVar5 = *(long *)&pGVar4[2].numPrimitives;
  lVar24 = (long)iVar16 * 0x38;
  lVar6 = *(long *)(lVar5 + lVar24);
  lVar23 = *(long *)(lVar5 + 0x10 + lVar24);
  auVar39 = *(undefined1 (*) [16])(lVar6 + lVar23 * uVar14);
  uVar17 = (ulong)(Disc->primIDs).field_0.i[1];
  auVar29 = *(undefined1 (*) [16])(lVar6 + lVar23 * uVar17);
  uVar20 = (ulong)(Disc->primIDs).field_0.i[2];
  auVar28 = *(undefined1 (*) [16])(lVar6 + lVar23 * uVar20);
  uVar22 = (ulong)(Disc->primIDs).field_0.i[3];
  auVar30 = *(undefined1 (*) [16])(lVar6 + lVar23 * uVar22);
  auVar32 = vunpcklps_avx(auVar39,auVar28);
  auVar37 = vunpckhps_avx(auVar39,auVar28);
  auVar39 = vunpcklps_avx(auVar29,auVar30);
  auVar38 = vunpckhps_avx(auVar29,auVar30);
  auVar35 = vunpcklps_avx(auVar32,auVar39);
  auVar32 = vunpckhps_avx(auVar32,auVar39);
  auVar36 = vunpcklps_avx(auVar37,auVar38);
  p_Var7 = pGVar4[2].intersectionFilterN;
  lVar6 = *(long *)(p_Var7 + lVar24);
  lVar23 = *(long *)(p_Var7 + lVar24 + 0x10);
  auVar39 = *(undefined1 (*) [16])(lVar6 + lVar23 * uVar14);
  auVar29 = *(undefined1 (*) [16])(lVar6 + lVar23 * uVar17);
  auVar28 = *(undefined1 (*) [16])(lVar6 + lVar23 * uVar20);
  auVar30 = *(undefined1 (*) [16])(lVar6 + lVar23 * uVar22);
  auVar34 = vunpcklps_avx(auVar39,auVar28);
  auVar39 = vunpckhps_avx(auVar39,auVar28);
  auVar28 = vunpcklps_avx(auVar29,auVar30);
  auVar29 = vunpckhps_avx(auVar29,auVar30);
  auVar44 = vunpcklps_avx(auVar39,auVar29);
  auVar45 = vunpcklps_avx(auVar34,auVar28);
  auVar34 = vunpckhps_avx(auVar34,auVar28);
  lVar23 = (long)(iVar16 + 1) * 0x38;
  lVar6 = *(long *)(lVar5 + lVar23);
  lVar5 = *(long *)(lVar5 + 0x10 + lVar23);
  auVar39 = *(undefined1 (*) [16])(lVar6 + lVar5 * uVar14);
  auVar29 = *(undefined1 (*) [16])(lVar6 + lVar5 * uVar17);
  auVar28 = *(undefined1 (*) [16])(lVar6 + lVar5 * uVar20);
  auVar30 = *(undefined1 (*) [16])(lVar6 + lVar5 * uVar22);
  auVar33 = vunpcklps_avx(auVar39,auVar28);
  auVar40 = vunpckhps_avx(auVar39,auVar28);
  auVar39 = vunpcklps_avx(auVar29,auVar30);
  auVar41 = vunpckhps_avx(auVar29,auVar30);
  auVar48 = vunpcklps_avx(auVar33,auVar39);
  auVar33 = vunpckhps_avx(auVar33,auVar39);
  auVar26 = vunpcklps_avx512vl(auVar40,auVar41);
  lVar5 = *(long *)(p_Var7 + lVar23);
  lVar6 = *(long *)(p_Var7 + lVar23 + 0x10);
  auVar39 = *(undefined1 (*) [16])(lVar5 + uVar14 * lVar6);
  auVar29 = *(undefined1 (*) [16])(lVar5 + uVar17 * lVar6);
  auVar28 = *(undefined1 (*) [16])(lVar5 + uVar20 * lVar6);
  auVar30 = *(undefined1 (*) [16])(lVar5 + lVar6 * uVar22);
  auVar27 = vunpcklps_avx512vl(auVar39,auVar28);
  auVar39 = vunpckhps_avx(auVar39,auVar28);
  auVar28 = vunpcklps_avx512vl(auVar29,auVar30);
  auVar29 = vunpckhps_avx512vl(auVar29,auVar30);
  auVar30 = vunpcklps_avx512vl(auVar39,auVar29);
  auVar31 = vunpcklps_avx512vl(auVar27,auVar28);
  auVar27 = vunpckhps_avx512vl(auVar27,auVar28);
  auVar46._4_4_ = fVar9;
  auVar46._0_4_ = fVar9;
  auVar46._8_4_ = fVar9;
  auVar46._12_4_ = fVar9;
  fVar1 = 1.0 - fVar9;
  auVar47._4_4_ = fVar1;
  auVar47._0_4_ = fVar1;
  auVar47._8_4_ = fVar1;
  auVar47._12_4_ = fVar1;
  auVar39._0_4_ = fVar9 * auVar48._0_4_;
  auVar39._4_4_ = fVar9 * auVar48._4_4_;
  auVar39._8_4_ = fVar9 * auVar48._8_4_;
  auVar39._12_4_ = fVar9 * auVar48._12_4_;
  auVar29._0_4_ = fVar9 * auVar33._0_4_;
  auVar29._4_4_ = fVar9 * auVar33._4_4_;
  auVar29._8_4_ = fVar9 * auVar33._8_4_;
  auVar29._12_4_ = fVar9 * auVar33._12_4_;
  auVar28 = vmulps_avx512vl(auVar46,auVar26);
  auVar39 = vfmadd231ps_fma(auVar39,auVar47,auVar35);
  auVar29 = vfmadd231ps_fma(auVar29,auVar47,auVar32);
  auVar28 = vfmadd231ps_fma(auVar28,auVar47,auVar36);
  auVar32 = vmulps_avx512vl(auVar46,auVar31);
  auVar33 = vmulps_avx512vl(auVar46,auVar27);
  auVar30 = vmulps_avx512vl(auVar46,auVar30);
  local_88 = vfmadd231ps_fma(auVar32,auVar47,auVar45);
  local_78 = vfmadd231ps_fma(auVar33,auVar47,auVar34);
  auVar32 = vpbroadcastd_avx512vl();
  uVar12 = vpcmpgtd_avx512vl(auVar32,_DAT_01f7fcf0);
  local_68 = vfmadd231ps_fma(auVar30,auVar47,auVar44);
  local_48 = vpbroadcastd_avx512vl();
  uVar2 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
  auVar44._4_4_ = uVar2;
  auVar44._0_4_ = uVar2;
  auVar44._8_4_ = uVar2;
  auVar44._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  auVar45._4_4_ = uVar2;
  auVar45._0_4_ = uVar2;
  auVar45._8_4_ = uVar2;
  auVar45._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8);
  auVar48._4_4_ = uVar2;
  auVar48._0_4_ = uVar2;
  auVar48._8_4_ = uVar2;
  auVar48._12_4_ = uVar2;
  auVar30 = vmulps_avx512vl(local_68,auVar48);
  auVar30 = vfmadd231ps_avx512vl(auVar30,auVar45,local_78);
  auVar30 = vfmadd231ps_avx512vl(auVar30,auVar44,local_88);
  uVar14 = vcmpps_avx512vl(auVar30,ZEXT816(0) << 0x20,0);
  fVar1 = (ray->super_RayK<1>).org.field_0.m128[0];
  auVar35._4_4_ = fVar1;
  auVar35._0_4_ = fVar1;
  auVar35._8_4_ = fVar1;
  auVar35._12_4_ = fVar1;
  auVar34 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
  auVar33 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
  auVar32 = vsubps_avx512vl(auVar39,auVar35);
  auVar35 = vsubps_avx512vl(auVar29,auVar34);
  auVar36 = vsubps_avx512vl(auVar28,auVar33);
  auVar36 = vmulps_avx512vl(local_68,auVar36);
  auVar35 = vfmadd231ps_avx512vl(auVar36,local_78,auVar35);
  auVar32 = vfmadd231ps_avx512vl(auVar35,local_88,auVar32);
  auVar30 = vdivps_avx512vl(auVar32,auVar30);
  bVar8 = (bool)((byte)uVar14 & 1);
  local_98._0_4_ = (uint)bVar8 * auVar32._0_4_ | (uint)!bVar8 * auVar30._0_4_;
  bVar8 = (bool)((byte)(uVar14 >> 1) & 1);
  local_98._4_4_ = (uint)bVar8 * auVar32._4_4_ | (uint)!bVar8 * auVar30._4_4_;
  bVar8 = (bool)((byte)(uVar14 >> 2) & 1);
  local_98._8_4_ = (uint)bVar8 * auVar32._8_4_ | (uint)!bVar8 * auVar30._8_4_;
  bVar8 = (bool)((byte)(uVar14 >> 3) & 1);
  local_98._12_4_ = (uint)bVar8 * auVar32._12_4_ | (uint)!bVar8 * auVar30._12_4_;
  auVar49 = ZEXT1664(local_98);
  uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar30._4_4_ = uVar2;
  auVar30._0_4_ = uVar2;
  auVar30._8_4_ = uVar2;
  auVar30._12_4_ = uVar2;
  uVar10 = vcmpps_avx512vl(local_98,auVar30,0xd);
  fVar3 = (ray->super_RayK<1>).tfar;
  auVar32._4_4_ = fVar3;
  auVar32._0_4_ = fVar3;
  auVar32._8_4_ = fVar3;
  auVar32._12_4_ = fVar3;
  uVar11 = vcmpps_avx512vl(local_98,auVar32,2);
  bVar18 = (byte)uVar10 & (byte)uVar11 & ~(byte)uVar14 & (byte)uVar12 & 0xf;
  if (bVar18 != 0) {
    auVar30 = vunpckhps_avx(auVar37,auVar38);
    auVar37 = vunpckhps_avx(auVar40,auVar41);
    auVar38._0_4_ = fVar9 * auVar37._0_4_;
    auVar38._4_4_ = fVar9 * auVar37._4_4_;
    auVar38._8_4_ = fVar9 * auVar37._8_4_;
    auVar38._12_4_ = fVar9 * auVar37._12_4_;
    auVar30 = vfmadd231ps_fma(auVar38,auVar47,auVar30);
    auVar37 = vmulps_avx512vl(auVar44,local_98);
    auVar38 = vmulps_avx512vl(auVar45,local_98);
    auVar32 = vmulps_avx512vl(auVar48,local_98);
    auVar40._0_4_ = fVar1 + auVar37._0_4_;
    auVar40._4_4_ = fVar1 + auVar37._4_4_;
    auVar40._8_4_ = fVar1 + auVar37._8_4_;
    auVar40._12_4_ = fVar1 + auVar37._12_4_;
    auVar37 = vaddps_avx512vl(auVar34,auVar38);
    auVar38 = vaddps_avx512vl(auVar33,auVar32);
    auVar39 = vsubps_avx(auVar40,auVar39);
    auVar29 = vsubps_avx(auVar37,auVar29);
    auVar28 = vsubps_avx(auVar38,auVar28);
    auVar37._0_4_ = auVar28._0_4_ * auVar28._0_4_;
    auVar37._4_4_ = auVar28._4_4_ * auVar28._4_4_;
    auVar37._8_4_ = auVar28._8_4_ * auVar28._8_4_;
    auVar37._12_4_ = auVar28._12_4_ * auVar28._12_4_;
    auVar29 = vfmadd231ps_fma(auVar37,auVar29,auVar29);
    auVar39 = vfmadd231ps_fma(auVar29,auVar39,auVar39);
    auVar28._0_4_ = auVar30._0_4_ * auVar30._0_4_;
    auVar28._4_4_ = auVar30._4_4_ * auVar30._4_4_;
    auVar28._8_4_ = auVar30._8_4_ * auVar30._8_4_;
    auVar28._12_4_ = auVar30._12_4_ * auVar30._12_4_;
    uVar10 = vcmpps_avx512vl(auVar39,auVar28,1);
    bVar18 = bVar18 & (byte)uVar10;
    uVar19 = (uint)bVar18;
    if (bVar18 != 0) {
      auVar34._0_4_ = (ray->super_RayK<1>).tfar;
      auVar34._4_4_ = (ray->super_RayK<1>).mask;
      auVar34._8_4_ = (ray->super_RayK<1>).id;
      auVar34._12_4_ = (ray->super_RayK<1>).flags;
      auVar43 = ZEXT1664(auVar34);
      uVar13 = vextractps_avx(auVar34,1);
      local_b8 = ZEXT432(0) << 0x20;
      auVar41._8_4_ = 0x7f800000;
      auVar41._0_8_ = 0x7f8000007f800000;
      auVar41._12_4_ = 0x7f800000;
      auVar42 = ZEXT1664(auVar41);
      auVar39 = vblendmps_avx512vl(auVar41,local_98);
      local_58._4_4_ = (uint)(bVar18 >> 1 & 1) * auVar39._4_4_;
      local_58._0_4_ = (uint)(bVar18 & 1) * auVar39._0_4_;
      local_58._8_4_ = (uint)(bVar18 >> 2 & 1) * auVar39._8_4_;
      local_58._12_4_ = (uint)(bVar18 >> 3) * auVar39._12_4_;
      auVar39 = vshufps_avx(local_58,local_58,0xb1);
      auVar39 = vminps_avx(auVar39,local_58);
      auVar29 = vshufpd_avx(auVar39,auVar39,1);
      auVar39 = vminps_avx(auVar29,auVar39);
      uVar10 = vcmpps_avx512vl(local_58,auVar39,0);
      bVar18 = (byte)uVar10 & bVar18;
      uVar25 = uVar19;
      if (bVar18 != 0) {
        uVar25 = (uint)bVar18;
      }
      uVar15 = 0;
      for (; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x80000000) {
        uVar15 = uVar15 + 1;
      }
      do {
        uVar25 = uVar15 & 0xff;
        local_110 = *(uint *)(local_48 + (ulong)uVar25 * 4);
        pGVar4 = (pSVar21->geometries).items[local_110].ptr;
        if ((pGVar4->mask & uVar13) == 0) {
          bVar18 = ~(byte)(1 << (uVar15 & 0x1f)) & (byte)uVar19;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            uVar14 = (ulong)(uVar25 << 2);
            fVar1 = *(float *)(local_b8 + uVar14);
            fVar3 = *(float *)(local_b8 + uVar14 + 0x10);
            (ray->super_RayK<1>).tfar = *(float *)(local_98 + uVar14);
            (ray->Ng).field_0.field_0.x = *(float *)(local_88 + uVar14);
            (ray->Ng).field_0.field_0.y = *(float *)(local_78 + uVar14);
            (ray->Ng).field_0.field_0.z = *(float *)(local_68 + uVar14);
            ray->u = fVar1;
            ray->v = fVar3;
            ray->primID = *(uint *)((long)&(Disc->primIDs).field_0 + uVar14);
            ray->geomID = local_110;
            ray->instID[0] = context->user->instID[0];
            ray->instPrimID[0] = context->user->instPrimID[0];
            return;
          }
          local_58 = auVar43._0_16_;
          local_c8 = auVar49._0_16_;
          uVar14 = (ulong)(uVar25 * 4);
          local_128 = *(undefined4 *)(local_88 + uVar14);
          local_124 = *(undefined4 *)(local_78 + uVar14);
          local_120 = *(undefined4 *)(local_68 + uVar14);
          local_11c = *(undefined4 *)(local_b8 + uVar14);
          local_118 = *(undefined4 *)(local_b8 + uVar14 + 0x10);
          local_114 = *(undefined4 *)((long)&(Disc->primIDs).field_0 + uVar14);
          local_10c = context->user->instID[0];
          local_108 = context->user->instPrimID[0];
          (ray->super_RayK<1>).tfar = *(float *)(local_98 + uVar14);
          local_134 = -1;
          local_f8.valid = &local_134;
          local_f8.geometryUserPtr = pGVar4->userPtr;
          local_f8.context = context->user;
          local_f8.ray = (RTCRayN *)ray;
          local_f8.hit = (RTCHitN *)&local_128;
          local_f8.N = 1;
          if ((pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
             ((*pGVar4->intersectionFilterN)(&local_f8), *local_f8.valid != 0)) {
            p_Var7 = context->args->filter;
            if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
               ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                  RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0)) &&
                ((*p_Var7)(&local_f8), *local_f8.valid == 0)))) goto LAB_01b40fbd;
            (((Vec3f *)((long)local_f8.ray + 0x30))->field_0).field_0.x = *(float *)local_f8.hit;
            (((Vec3f *)((long)local_f8.ray + 0x30))->field_0).field_0.y =
                 *(float *)(local_f8.hit + 4);
            (((Vec3f *)((long)local_f8.ray + 0x30))->field_0).field_0.z =
                 *(float *)(local_f8.hit + 8);
            *(float *)((long)local_f8.ray + 0x3c) = *(float *)(local_f8.hit + 0xc);
            local_58 = ZEXT416((uint)*(float *)(local_f8.hit + 0x10));
            *(float *)((long)local_f8.ray + 0x40) = *(float *)(local_f8.hit + 0x10);
            *(float *)((long)local_f8.ray + 0x44) = *(float *)(local_f8.hit + 0x14);
            *(float *)((long)local_f8.ray + 0x48) = *(float *)(local_f8.hit + 0x18);
            *(float *)((long)local_f8.ray + 0x4c) = *(float *)(local_f8.hit + 0x1c);
            *(float *)((long)local_f8.ray + 0x50) = *(float *)(local_f8.hit + 0x20);
          }
          else {
LAB_01b40fbd:
            (ray->super_RayK<1>).tfar = local_58._0_4_;
          }
          auVar49 = ZEXT1664(local_c8);
          auVar42 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar33._0_4_ = (ray->super_RayK<1>).tfar;
          auVar33._4_4_ = (ray->super_RayK<1>).mask;
          auVar33._8_4_ = (ray->super_RayK<1>).id;
          auVar33._12_4_ = (ray->super_RayK<1>).flags;
          auVar43 = ZEXT1664(auVar33);
          fVar1 = (ray->super_RayK<1>).tfar;
          auVar36._4_4_ = fVar1;
          auVar36._0_4_ = fVar1;
          auVar36._8_4_ = fVar1;
          auVar36._12_4_ = fVar1;
          uVar10 = vcmpps_avx512vl(local_c8,auVar36,2);
          bVar18 = ~(byte)(1 << (uVar15 & 0x1f)) & (byte)uVar19 & (byte)uVar10;
          uVar13 = vextractps_avx(auVar33,1);
          pSVar21 = local_130;
        }
        uVar19 = (uint)bVar18;
        if (bVar18 == 0) {
          return;
        }
        auVar39 = vblendmps_avx512vl(auVar42._0_16_,auVar49._0_16_);
        auVar26._0_4_ =
             (uint)(bVar18 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar18 & 1) * local_58._0_4_;
        bVar8 = (bool)(bVar18 >> 1 & 1);
        auVar26._4_4_ = (uint)bVar8 * auVar39._4_4_ | (uint)!bVar8 * local_58._4_4_;
        bVar8 = (bool)(bVar18 >> 2 & 1);
        auVar26._8_4_ = (uint)bVar8 * auVar39._8_4_ | (uint)!bVar8 * local_58._8_4_;
        auVar26._12_4_ =
             (uint)(bVar18 >> 3) * auVar39._12_4_ | (uint)!(bool)(bVar18 >> 3) * local_58._12_4_;
        auVar39 = vshufps_avx(auVar26,auVar26,0xb1);
        auVar39 = vminps_avx(auVar39,auVar26);
        auVar29 = vshufpd_avx(auVar39,auVar39,1);
        auVar39 = vminps_avx(auVar29,auVar39);
        uVar10 = vcmpps_avx512vl(auVar26,auVar39,0);
        bVar18 = (byte)uVar10 & bVar18;
        uVar25 = uVar19;
        if (bVar18 != 0) {
          uVar25 = (uint)bVar18;
        }
        uVar15 = 0;
        for (; local_58 = auVar26, (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x80000000) {
          uVar15 = uVar15 + 1;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre,
                                          RayHit& ray,
                                          RayQueryContext* context,
                                          const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom, ray.time());
        const vbool<M> valid = Disc.valid();
        DiscIntersector1<M>::intersect(
          valid, ray, context, geom, pre, v0, n0, Intersect1EpilogM<M, filter>(ray, context, Disc.geomID(), Disc.primID()));
      }